

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

result __thiscall
fmt::v6::detail::grisu_shortest_handler::on_digit
          (grisu_shortest_handler *this,char digit,uint64_t divisor,uint64_t remainder,
          uint64_t error,int exp,bool integral)

{
  int iVar1;
  ulong uVar2;
  double in_XMM0_Qa;
  long local_68;
  uint64_t down;
  uint64_t up;
  uint64_t unit;
  bool integral_local;
  int exp_local;
  uint64_t error_local;
  uint64_t remainder_local;
  uint64_t divisor_local;
  char digit_local;
  grisu_shortest_handler *this_local;
  
  iVar1 = this->size;
  this->size = iVar1 + 1;
  this->buf[iVar1] = digit;
  if (remainder < error) {
    if (integral) {
      local_68 = 1;
    }
    else {
      local_68 = *(long *)(basic_data<void>::powers_of_10_64 + (long)-exp * 8);
    }
    round(this,in_XMM0_Qa);
    uVar2 = (this->diff + 1) * local_68;
    if (((remainder < uVar2) && (divisor <= error - remainder)) &&
       ((remainder + divisor < uVar2 || ((remainder + divisor) - uVar2 < uVar2 - remainder)))) {
      this_local._4_4_ = error;
    }
    else {
      this_local._4_4_ = error;
      if (((ulong)(local_68 * 2) < remainder || local_68 * 2 - remainder == 0) &&
          remainder <= error + local_68 * -4) {
        this_local._4_4_ = done;
      }
    }
  }
  else {
    this_local._4_4_ = more;
  }
  return this_local._4_4_;
}

Assistant:

digits::result on_digit(char digit, uint64_t divisor, uint64_t remainder,
                          uint64_t error, int exp, bool integral) {
    buf[size++] = digit;
    if (remainder >= error) return digits::more;
    uint64_t unit = integral ? 1 : data::powers_of_10_64[-exp];
    uint64_t up = (diff - 1) * unit;  // wp_Wup
    round(up, divisor, remainder, error);
    uint64_t down = (diff + 1) * unit;  // wp_Wdown
    if (remainder < down && error - remainder >= divisor &&
        (remainder + divisor < down ||
         down - remainder > remainder + divisor - down)) {
      return digits::error;
    }
    return 2 * unit <= remainder && remainder <= error - 4 * unit
               ? digits::done
               : digits::error;
  }